

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spgmr.c
# Opt level: O3

int SUNLinSolSolve_SPGMR(SUNLinearSolver S,SUNMatrix A,N_Vector x,N_Vector b,sunrealtype delta)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint *puVar6;
  undefined8 *puVar7;
  long lVar8;
  long lVar9;
  undefined8 uVar10;
  double *pdVar11;
  undefined8 uVar12;
  long lVar13;
  long lVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  code *pcVar17;
  code *pcVar18;
  undefined8 *puVar19;
  undefined8 *puVar20;
  bool bVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  ulong uVar26;
  double *pdVar27;
  ulong uVar28;
  uint uVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  bool bVar33;
  double dVar34;
  double dVar35;
  double local_f0;
  undefined1 local_e8 [16];
  double local_48;
  
  puVar6 = (uint *)S->content;
  uVar2 = *puVar6;
  uVar26 = (ulong)uVar2;
  uVar3 = puVar6[2];
  uVar4 = puVar6[3];
  puVar7 = *(undefined8 **)(puVar6 + 0x18);
  lVar8 = *(long *)(puVar6 + 0x1a);
  lVar9 = *(long *)(puVar6 + 0x1c);
  uVar10 = *(undefined8 *)(puVar6 + 0x1e);
  pdVar11 = *(double **)(puVar6 + 0x20);
  uVar12 = *(undefined8 *)(puVar6 + 0x22);
  lVar13 = *(long *)(puVar6 + 0x14);
  lVar14 = *(long *)(puVar6 + 0x16);
  uVar15 = *(undefined8 *)(puVar6 + 0xc);
  uVar16 = *(undefined8 *)(puVar6 + 0x12);
  pcVar17 = *(code **)(puVar6 + 10);
  pcVar18 = *(code **)(puVar6 + 0x10);
  puVar19 = *(undefined8 **)(puVar6 + 0x24);
  puVar20 = *(undefined8 **)(puVar6 + 0x26);
  puVar6[5] = 0;
  uVar5 = puVar6[1];
  if (puVar6[4] == 0) {
    iVar23 = (*pcVar17)(uVar15,x,uVar12);
    if (iVar23 != 0) {
LAB_0016f7b4:
      bVar33 = iVar23 < 0;
      puVar6[4] = 0;
      iVar23 = -0x325;
      iVar24 = 0x323;
LAB_0016f7c6:
      if (bVar33) {
        iVar24 = iVar23;
      }
      goto LAB_0016ff04;
    }
    N_VLinearSum(0x3ff0000000000000,b,uVar12,uVar12);
  }
  else {
    N_VScale(0x3ff0000000000000,b,uVar12);
  }
  N_VScale(0x3ff0000000000000,uVar12,*puVar7);
  uVar22 = uVar5 | 2;
  if (uVar22 == 3) {
    iVar23 = (*pcVar18)(delta,uVar16,*puVar7,uVar12,1);
    if (iVar23 != 0) {
      puVar6[4] = 0;
      iVar24 = 0x325;
      if (iVar23 < 0) {
        iVar24 = -0x328;
      }
      goto LAB_0016ff04;
    }
  }
  else {
    N_VScale(0x3ff0000000000000,*puVar7,uVar12);
  }
  if (lVar13 == 0) {
    N_VScale(0x3ff0000000000000,uVar12,*puVar7);
  }
  else {
    N_VProd(lVar13,uVar12);
  }
  dVar34 = (double)N_VDotProd();
  dVar35 = 0.0;
  if (0.0 < dVar34) {
    if (dVar34 < 0.0) {
      dVar35 = sqrt(dVar34);
    }
    else {
      dVar35 = SQRT(dVar34);
    }
  }
  *(double *)(puVar6 + 6) = dVar35;
  if (dVar35 <= delta) {
    puVar6[4] = 0;
    iVar24 = 0;
    goto LAB_0016ff04;
  }
  N_VConst(0,uVar10);
  if (-1 < (int)uVar4) {
    uVar5 = uVar5 & 0xfffffffe;
    uVar25 = 0;
    local_e8._0_4_ = SUB84(dVar35,0);
    local_e8._4_4_ = (undefined4)((ulong)dVar35 >> 0x20);
    local_e8._8_4_ = 0;
    local_e8._12_4_ = 0;
    uVar28 = 0;
    local_48 = dVar35;
    do {
      if ((int)uVar2 < 0) {
        N_VScale(*puVar7,*puVar7);
        bVar21 = false;
      }
      else {
        uVar32 = 0;
        do {
          if (0 < (int)uVar2) {
            memset(*(void **)(lVar8 + uVar32 * 8),0,uVar26 * 8);
          }
          uVar32 = uVar32 + 1;
        } while (uVar2 + 1 != uVar32);
        N_VScale(1.0 / (double)CONCAT44(local_e8._4_4_,local_e8._0_4_),*puVar7,*puVar7);
        if ((int)uVar2 < 1) {
          bVar21 = false;
        }
        else {
          bVar21 = true;
          lVar31 = 4;
          local_f0 = 1.0;
          uVar32 = 0;
          do {
            puVar6[5] = puVar6[5] + 1;
            if (lVar14 == 0) {
              N_VScale(0x3ff0000000000000,puVar7[uVar32],uVar12);
            }
            else {
              N_VDiv(puVar7[uVar32],lVar14,uVar12);
            }
            if (uVar5 == 2) {
              N_VScale(0x3ff0000000000000,uVar12,puVar7[uVar32 + 1]);
              iVar23 = (*pcVar18)(delta,uVar16,puVar7[uVar32 + 1],uVar12,2);
              bVar33 = iVar23 < 0;
              if (iVar23 != 0) goto LAB_0016fedb;
            }
            iVar23 = (*pcVar17)(uVar15,uVar12,puVar7[uVar32 + 1]);
            if (iVar23 != 0) goto LAB_0016f7b4;
            if (uVar22 == 3) {
              iVar23 = (*pcVar18)(delta,uVar16,puVar7[uVar32 + 1],uVar12,1);
              bVar33 = iVar23 < 0;
              if (iVar23 != 0) goto LAB_0016fedb;
            }
            else {
              N_VScale(0x3ff0000000000000,puVar7[uVar32 + 1],uVar12);
            }
            if (lVar13 == 0) {
              N_VScale(0x3ff0000000000000,uVar12,puVar7[uVar32 + 1]);
            }
            else {
              N_VProd(lVar13,uVar12);
            }
            uVar1 = uVar32 + 1;
            lVar30 = *(long *)(lVar8 + 8 + uVar32 * 8) + lVar31 + -4;
            if (uVar3 == 2) {
              SUNClassicalGS(puVar7,lVar8,uVar1 & 0xffffffff,uVar26,lVar30,puVar19,puVar20);
            }
            else {
              SUNModifiedGS(puVar7,lVar8,uVar1 & 0xffffffff,uVar26,lVar30);
            }
            iVar23 = SUNQRfact(uVar1 & 0xffffffff,lVar8,lVar9,uVar32 & 0xffffffff);
            if (iVar23 != 0) {
              puVar6[4] = 0;
              iVar24 = 0x327;
              goto LAB_0016ff04;
            }
            local_f0 = local_f0 * *(double *)(lVar9 + lVar31 * 2);
            local_48 = ABS((double)local_e8._0_8_ * local_f0);
            *(double *)(puVar6 + 6) = local_48;
            if (local_48 <= delta) {
              uVar28 = (ulong)((int)uVar32 + 1);
              break;
            }
            N_VScale(1.0 / *(double *)(*(long *)(lVar8 + 8 + uVar32 * 8) + uVar32 * 8),
                     puVar7[uVar32 + 1],puVar7[uVar32 + 1]);
            bVar21 = (long)uVar1 < (long)(int)uVar2;
            lVar31 = lVar31 + 8;
            uVar32 = uVar1;
            uVar28 = uVar26;
          } while (uVar26 != uVar1);
        }
      }
      *pdVar11 = (double)CONCAT44(local_e8._4_4_,local_e8._0_4_);
      iVar23 = (int)uVar28;
      if (0 < iVar23) {
        memset(pdVar11 + 1,0,uVar28 * 8);
      }
      iVar24 = SUNQRsol(uVar28,lVar8,lVar9,pdVar11);
      if (iVar24 != 0) {
        puVar6[4] = 0;
        iVar24 = -0x32b;
        goto LAB_0016ff04;
      }
      *puVar19 = 0x3ff0000000000000;
      *puVar20 = uVar10;
      if (0 < iVar23) {
        uVar32 = 0;
        do {
          puVar19[uVar32 + 1] = pdVar11[uVar32];
          puVar20[uVar32 + 1] = puVar7[uVar32];
          uVar32 = uVar32 + 1;
        } while (uVar28 != uVar32);
      }
      uVar29 = iVar23 + 1;
      N_VLinearCombination();
      if (bVar21) {
        if (lVar14 != 0) {
          N_VDiv(uVar10,lVar14,uVar10);
        }
        if (uVar5 == 2) {
          iVar23 = (*pcVar18)(delta,uVar16,uVar10,uVar12,2);
          bVar33 = iVar23 < 0;
          if (iVar23 != 0) goto LAB_0016fedb;
        }
        else {
          N_VScale(0x3ff0000000000000,uVar10,uVar12);
        }
        if (puVar6[4] == 0) {
          N_VLinearSum(0x3ff0000000000000,0,x,uVar12,x);
        }
        else {
          N_VScale(0x3ff0000000000000,uVar12,x);
        }
        puVar6[4] = 0;
        iVar24 = 0;
        goto LAB_0016ff04;
      }
      if (uVar25 == uVar4) goto LAB_0016fe70;
      dVar34 = 1.0;
      if (0 < iVar23) {
        pdVar27 = (double *)(uVar28 * 0x10 + lVar9 + -8);
        uVar32 = uVar28 + 1;
        dVar34 = 1.0;
        do {
          pdVar11[uVar32 - 1] = pdVar27[-1] * dVar34;
          dVar34 = dVar34 * *pdVar27;
          pdVar27 = pdVar27 + -2;
          uVar32 = uVar32 - 1;
        } while (1 < uVar32);
      }
      *pdVar11 = dVar34;
      dVar34 = (double)local_e8._0_8_ * dVar34;
      if (iVar23 < 0) {
        uVar32 = local_e8._8_8_ & 0x7fffffffffffffff;
        local_e8._8_4_ = (int)uVar32;
        local_e8._0_8_ = ABS(dVar34);
        local_e8._12_4_ = (int)(uVar32 >> 0x20);
      }
      else {
        uVar32 = 0;
        do {
          pdVar11[uVar32] = pdVar11[uVar32] * dVar34;
          uVar32 = uVar32 + 1;
        } while (uVar29 != uVar32);
        uVar32 = local_e8._8_8_ & 0x7fffffffffffffff;
        local_e8._8_4_ = (int)uVar32;
        local_e8._0_8_ = ABS(dVar34);
        local_e8._12_4_ = (int)(uVar32 >> 0x20);
        if (-1 < iVar23) {
          uVar32 = 0;
          do {
            puVar19[uVar32] = pdVar11[uVar32];
            puVar20[uVar32] = puVar7[uVar32];
            uVar32 = uVar32 + 1;
          } while (uVar29 != uVar32);
        }
      }
      N_VLinearCombination(uVar29,puVar19,puVar20,*puVar7);
      uVar25 = uVar25 + 1;
    } while( true );
  }
  goto LAB_0016fef2;
LAB_0016fe70:
  if (local_48 < dVar35) {
    if (lVar14 != 0) {
      N_VDiv(uVar10,lVar14,uVar10);
    }
    if (uVar5 == 2) {
      iVar23 = (*pcVar18)(delta,uVar16,uVar10,uVar12,2);
      bVar33 = iVar23 < 0;
      if (iVar23 != 0) {
LAB_0016fedb:
        puVar6[4] = 0;
        iVar23 = -0x328;
        iVar24 = 0x325;
        goto LAB_0016f7c6;
      }
    }
    else {
      N_VScale(0x3ff0000000000000,uVar10,uVar12);
    }
    if (puVar6[4] == 0) {
      N_VLinearSum(0x3ff0000000000000,0,x,uVar12,x);
    }
    else {
      N_VScale(0x3ff0000000000000,uVar12,x);
    }
    puVar6[4] = 0;
    iVar24 = 0x321;
    goto LAB_0016ff04;
  }
LAB_0016fef2:
  puVar6[4] = 0;
  iVar24 = 0x322;
LAB_0016ff04:
  *(int *)((long)S->content + 0x20) = iVar24;
  return iVar24;
}

Assistant:

int SUNLinSolSolve_SPGMR(SUNLinearSolver S, SUNDIALS_MAYBE_UNUSED SUNMatrix A,
                         N_Vector x, N_Vector b, sunrealtype delta)
{
  SUNFunctionBegin(S->sunctx);

  /* local data and shortcut variables */
  N_Vector *V, xcor, vtemp, s1, s2;
  sunrealtype **Hes, *givens, *yg, *res_norm;
  sunrealtype beta, rotation_product, r_norm, s_product, rho;
  sunbooleantype preOnLeft, preOnRight, scale2, scale1, converged;
  sunbooleantype* zeroguess;
  int i, j, k, l, l_plus_1, l_max, krydim, ntries, max_restarts, gstype;
  int* nli;
  void *A_data, *P_data;
  SUNATimesFn atimes;
  SUNPSolveFn psolve;
  sunrealtype* cv;
  N_Vector* Xv;
  int status;

  /* Initialize some variables */
  l_plus_1 = 0;
  krydim   = 0;

  /* Make local shortcuts to solver variables. */
  l_max        = SPGMR_CONTENT(S)->maxl;
  max_restarts = SPGMR_CONTENT(S)->max_restarts;
  gstype       = SPGMR_CONTENT(S)->gstype;
  V            = SPGMR_CONTENT(S)->V;
  Hes          = SPGMR_CONTENT(S)->Hes;
  givens       = SPGMR_CONTENT(S)->givens;
  xcor         = SPGMR_CONTENT(S)->xcor;
  yg           = SPGMR_CONTENT(S)->yg;
  vtemp        = SPGMR_CONTENT(S)->vtemp;
  s1           = SPGMR_CONTENT(S)->s1;
  s2           = SPGMR_CONTENT(S)->s2;
  A_data       = SPGMR_CONTENT(S)->ATData;
  P_data       = SPGMR_CONTENT(S)->PData;
  atimes       = SPGMR_CONTENT(S)->ATimes;
  psolve       = SPGMR_CONTENT(S)->Psolve;
  zeroguess    = &(SPGMR_CONTENT(S)->zeroguess);
  nli          = &(SPGMR_CONTENT(S)->numiters);
  res_norm     = &(SPGMR_CONTENT(S)->resnorm);
  cv           = SPGMR_CONTENT(S)->cv;
  Xv           = SPGMR_CONTENT(S)->Xv;

  /* Initialize counters and convergence flag */
  *nli      = 0;
  converged = SUNFALSE;

  /* Set sunbooleantype flags for internal solver options */
  preOnLeft  = ((SPGMR_CONTENT(S)->pretype == SUN_PREC_LEFT) ||
               (SPGMR_CONTENT(S)->pretype == SUN_PREC_BOTH));
  preOnRight = ((SPGMR_CONTENT(S)->pretype == SUN_PREC_RIGHT) ||
                (SPGMR_CONTENT(S)->pretype == SUN_PREC_BOTH));
  scale1     = (s1 != NULL);
  scale2     = (s2 != NULL);

  /* Check if Atimes function has been set */
  SUNAssert(atimes, SUN_ERR_ARG_CORRUPT);

  /* If preconditioning, check if psolve has been set */
  SUNAssert(!(preOnLeft || preOnRight) || psolve, SUN_ERR_ARG_CORRUPT);

  SUNLogInfo(S->sunctx->logger, "linear-solver", "solver = spgmr");

  SUNLogInfo(S->sunctx->logger, "begin-linear-iterate", "");

  /* Set vtemp and V[0] to initial (unscaled) residual r_0 = b - A*x_0 */
  if (*zeroguess)
  {
    N_VScale(ONE, b, vtemp);
    SUNCheckLastErr();
  }
  else
  {
    status = atimes(A_data, x, vtemp);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                 : SUNLS_ATIMES_FAIL_REC;

      SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                 "status = failed matvec, retval = %d", status);

      return (LASTFLAG(S));
    }
    N_VLinearSum(ONE, b, -ONE, vtemp, vtemp);
    SUNCheckLastErr();
  }
  N_VScale(ONE, vtemp, V[0]);
  SUNCheckLastErr();

  /* Apply left preconditioner and left scaling to V[0] = r_0 */
  if (preOnLeft)
  {
    status = psolve(P_data, V[0], vtemp, delta, SUN_PREC_LEFT);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                 : SUNLS_PSOLVE_FAIL_REC;

      SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                 "status = failed preconditioner solve, retval = %d", status);

      return (LASTFLAG(S));
    }
  }
  else
  {
    N_VScale(ONE, V[0], vtemp);
    SUNCheckLastErr();
  }

  if (scale1)
  {
    N_VProd(s1, vtemp, V[0]);
    SUNCheckLastErr();
  }
  else
  {
    N_VScale(ONE, vtemp, V[0]);
    SUNCheckLastErr();
  }

  /* Set r_norm = beta to L2 norm of V[0] = s1 P1_inv r_0, and
     return if small  */
  r_norm = N_VDotProd(V[0], V[0]);
  SUNCheckLastErr();
  *res_norm = r_norm = beta = SUNRsqrt(r_norm);

  if (r_norm <= delta)
  {
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUN_SUCCESS;

    SUNLogInfo(S->sunctx->logger,
               "end-linear-iterate", "cur-iter = 0, total-iters = 0, res-norm = %.16g, status = success",
               *res_norm);

    return (LASTFLAG(S));
  }

  SUNLogInfo(S->sunctx->logger,
             "end-linear-iterate", "cur-iter = 0, total-iters = 0, res-norm = %.16g, status = continue",
             *res_norm);

  /* Initialize rho to avoid compiler warning message */
  rho = beta;

  /* Set xcor = 0 */
  N_VConst(ZERO, xcor);
  SUNCheckLastErr();

  /* Begin outer iterations: up to (max_restarts + 1) attempts */
  for (ntries = 0; ntries <= max_restarts; ntries++)
  {
    /* Initialize the Hessenberg matrix Hes and Givens rotation
       product.  Normalize the initial vector V[0] */
    for (i = 0; i <= l_max; i++)
    {
      for (j = 0; j < l_max; j++) { Hes[i][j] = ZERO; }
    }

    rotation_product = ONE;
    N_VScale(ONE / r_norm, V[0], V[0]);
    SUNCheckLastErr();

    /* Inner loop: generate Krylov sequence and Arnoldi basis */
    for (l = 0; l < l_max; l++)
    {
      SUNLogInfo(S->sunctx->logger, "begin-linear-iterate", "");

      (*nli)++;
      krydim = l_plus_1 = l + 1;

      /* Generate A-tilde V[l], where A-tilde = s1 P1_inv A P2_inv s2_inv */

      /*   Apply right scaling: vtemp = s2_inv V[l] */
      if (scale2)
      {
        N_VDiv(V[l], s2, vtemp);
        SUNCheckLastErr();
      }
      else
      {
        N_VScale(ONE, V[l], vtemp);
        SUNCheckLastErr();
      }

      /*   Apply right preconditioner: vtemp = P2_inv s2_inv V[l] */
      if (preOnRight)
      {
        N_VScale(ONE, vtemp, V[l_plus_1]);
        SUNCheckLastErr();
        status = psolve(P_data, V[l_plus_1], vtemp, delta, SUN_PREC_RIGHT);
        if (status != 0)
        {
          *zeroguess  = SUNFALSE;
          LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                     : SUNLS_PSOLVE_FAIL_REC;

          SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                     "status = failed preconditioner solve, retval = %d", status);

          return (LASTFLAG(S));
        }
      }

      /* Apply A: V[l+1] = A P2_inv s2_inv V[l] */
      status = atimes(A_data, vtemp, V[l_plus_1]);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                   : SUNLS_ATIMES_FAIL_REC;

        SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                   "status = failed matvec, retval = %d", status);

        return (LASTFLAG(S));
      }

      /* Apply left preconditioning: vtemp = P1_inv A P2_inv s2_inv V[l] */
      if (preOnLeft)
      {
        status = psolve(P_data, V[l_plus_1], vtemp, delta, SUN_PREC_LEFT);
        if (status != 0)
        {
          *zeroguess  = SUNFALSE;
          LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                     : SUNLS_PSOLVE_FAIL_REC;

          SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                     "status = failed preconditioner solve, retval = %d", status);

          return (LASTFLAG(S));
        }
      }
      else
      {
        N_VScale(ONE, V[l_plus_1], vtemp);
        SUNCheckLastErr();
      }

      /* Apply left scaling: V[l+1] = s1 P1_inv A P2_inv s2_inv V[l] */
      if (scale1)
      {
        N_VProd(s1, vtemp, V[l_plus_1]);
        SUNCheckLastErr();
      }
      else
      {
        N_VScale(ONE, vtemp, V[l_plus_1]);
        SUNCheckLastErr();
      }

      /*  Orthogonalize V[l+1] against previous V[i]: V[l+1] = w_tilde */
      if (gstype == SUN_CLASSICAL_GS)
      {
        SUNCheckCall(
          SUNClassicalGS(V, Hes, l_plus_1, l_max, &(Hes[l_plus_1][l]), cv, Xv));
      }
      else
      {
        SUNCheckCall(SUNModifiedGS(V, Hes, l_plus_1, l_max, &(Hes[l_plus_1][l])));
      }

      /*  Update the QR factorization of Hes */
      if (SUNQRfact(krydim, Hes, givens, l) != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = SUNLS_QRFACT_FAIL;

        SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                   "status = failed QR factorization");

        return (LASTFLAG(S));
      }

      /*  Update residual norm estimate; break if convergence test passes */
      rotation_product *= givens[2 * l + 1];
      *res_norm = rho = SUNRabs(rotation_product * r_norm);

      SUNLogInfo(S->sunctx->logger, "linear-iterate",
                 "cur-iter = %i, total-iters = %i, res-norm = %.16g", l + 1,
                 *nli, *res_norm);

      if (rho <= delta)
      {
        converged = SUNTRUE;
        break;
      }

      /* Normalize V[l+1] with norm value from the Gram-Schmidt routine */
      N_VScale(ONE / Hes[l_plus_1][l], V[l_plus_1], V[l_plus_1]);
      SUNCheckLastErr();

      SUNLogInfoIf(l < l_max - 1, S->sunctx->logger, "end-linear-iterate",
                   "status = continue");
    }

    /* Inner loop is done.  Compute the new correction vector xcor */

    /*   Construct g, then solve for y */
    yg[0] = r_norm;
    for (i = 1; i <= krydim; i++) { yg[i] = ZERO; }
    if (SUNQRsol(krydim, Hes, givens, yg) != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = SUNLS_QRSOL_FAIL;

      SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                 "status = failed QR solve");

      return (LASTFLAG(S));
    }

    /*   Add correction vector V_l y to xcor */
    cv[0] = ONE;
    Xv[0] = xcor;

    for (k = 0; k < krydim; k++)
    {
      cv[k + 1] = yg[k];
      Xv[k + 1] = V[k];
    }
    SUNCheckCall(N_VLinearCombination(krydim + 1, cv, Xv, xcor));

    /* If converged, construct the final solution vector x and return */
    if (converged)
    {
      /* Apply right scaling and right precond.: vtemp = P2_inv s2_inv xcor */
      if (scale2)
      {
        N_VDiv(xcor, s2, xcor);
        SUNCheckLastErr();
      }

      if (preOnRight)
      {
        status = psolve(P_data, xcor, vtemp, delta, SUN_PREC_RIGHT);
        if (status != 0)
        {
          *zeroguess  = SUNFALSE;
          LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                     : SUNLS_PSOLVE_FAIL_REC;

          SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                     "status = failed preconditioner solve, retval = %d", status);

          return (LASTFLAG(S));
        }
      }
      else
      {
        N_VScale(ONE, xcor, vtemp);
        SUNCheckLastErr();
      }

      /* Add vtemp to initial x to get final solution x, and return */
      if (*zeroguess)
      {
        N_VScale(ONE, vtemp, x);
        SUNCheckLastErr();
      }
      else
      {
        N_VLinearSum(ONE, x, ONE, vtemp, x);
        SUNCheckLastErr();
      }

      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = SUN_SUCCESS;

      SUNLogInfo(S->sunctx->logger, "end-linear-iterate", "status = success");

      return (LASTFLAG(S));
    }

    /* Not yet converged; if allowed, prepare for restart */
    if (ntries == max_restarts) { break; }

    /* Construct last column of Q in yg */
    s_product = ONE;
    for (i = krydim; i > 0; i--)
    {
      yg[i] = s_product * givens[2 * i - 2];
      s_product *= givens[2 * i - 1];
    }
    yg[0] = s_product;

    /* Scale r_norm and yg */
    r_norm *= s_product;
    for (i = 0; i <= krydim; i++) { yg[i] *= r_norm; }
    r_norm = SUNRabs(r_norm);

    /* Multiply yg by V_(krydim+1) to get last residual vector; restart */
    for (k = 0; k <= krydim; k++)
    {
      cv[k] = yg[k];
      Xv[k] = V[k];
    }
    SUNCheckCall(N_VLinearCombination(krydim + 1, cv, Xv, V[0]));

    SUNLogInfo(S->sunctx->logger, "end-linear-iterate", "status = continue");
  }

  /* Failed to converge, even after allowed restarts.
     If the residual norm was reduced below its initial value, compute
     and return x anyway.  Otherwise return failure flag. */
  if (rho < beta)
  {
    /* Apply right scaling and right precond.: vtemp = P2_inv s2_inv xcor */
    if (scale2)
    {
      N_VDiv(xcor, s2, xcor);
      SUNCheckLastErr();
    }

    if (preOnRight)
    {
      status = psolve(P_data, xcor, vtemp, delta, SUN_PREC_RIGHT);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                   : SUNLS_PSOLVE_FAIL_REC;

        SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                   "status = failed preconditioner solve, retval = %d", status);

        return (LASTFLAG(S));
      }
    }
    else
    {
      N_VScale(ONE, xcor, vtemp);
      SUNCheckLastErr();
    }

    /* Add vtemp to initial x to get final solution x, and return */
    if (*zeroguess)
    {
      N_VScale(ONE, vtemp, x);
      SUNCheckLastErr();
    }
    else
    {
      N_VLinearSum(ONE, x, ONE, vtemp, x);
      SUNCheckLastErr();
    }

    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUNLS_RES_REDUCED;

    SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
               "status = failed residual reduced");

    return (LASTFLAG(S));
  }

  *zeroguess  = SUNFALSE;
  LASTFLAG(S) = SUNLS_CONV_FAIL;

  SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
             "status = failed max iterations");

  return (LASTFLAG(S));
}